

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void L3_reorder(float *grbuf,float *scratch,uint8_t *sfb)

{
  uint uVar1;
  undefined4 *puVar2;
  byte *in_RDX;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  float *dst;
  float *src;
  int len;
  int i;
  undefined4 *local_30;
  undefined4 *local_28;
  int local_1c;
  byte *local_18;
  
  local_30 = in_RSI;
  local_28 = in_RDI;
  for (local_18 = in_RDX; uVar1 = (uint)*local_18, uVar1 != 0; local_18 = local_18 + 3) {
    for (local_1c = 0; local_1c < (int)uVar1; local_1c = local_1c + 1) {
      *local_30 = *local_28;
      puVar2 = local_30 + 2;
      local_30[1] = local_28[(int)uVar1];
      local_30 = local_30 + 3;
      *puVar2 = local_28[(int)(uVar1 << 1)];
      local_28 = local_28 + 1;
    }
    local_28 = local_28 + (int)(uVar1 << 1);
  }
  memcpy(in_RDI,in_RSI,((long)local_30 - (long)in_RSI >> 2) << 2);
  return;
}

Assistant:

static void L3_reorder(float *grbuf, float *scratch, const uint8_t *sfb)
{
    int i, len;
    float *src = grbuf, *dst = scratch;

    for (;0 != (len = *sfb); sfb += 3, src += 2*len)
    {
        for (i = 0; i < len; i++, src++)
        {
            *dst++ = src[0*len];
            *dst++ = src[1*len];
            *dst++ = src[2*len];
        }
    }
    memcpy(grbuf, scratch, (dst - scratch)*sizeof(float));
}